

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O1

void losexp(char *drainer)

{
  char cVar1;
  boolean bVar3;
  schar sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char cVar2;
  
  if ((drainer == (char *)0x0) || (iVar5 = strcmp(drainer,"#levelchange"), iVar5 != 0)) {
    bVar3 = resists_drli(&youmonst);
    if (bVar3 != '\0') {
      return;
    }
  }
  else {
    drainer = (char *)0x0;
  }
  if (u.ulevel < 2) {
    if (drainer != (char *)0x0) {
      killer_format = 1;
      killer = drainer;
      done(0);
    }
    u.uexp = 0;
  }
  else {
    pcVar8 = Goodbye();
    u.ulevel = u.ulevel + -1;
    pline("%s level %d.",pcVar8);
    adjabil(u.ulevel + 1,u.ulevel);
    reset_rndmonst(-1);
  }
  iVar6 = newhp();
  iVar5 = u.ulevel;
  u.uhpmax = u.uhpmax - iVar6;
  if (u.uhpmax < 2) {
    u.uhpmax = 1;
  }
  iVar11 = u.uhp - iVar6;
  iVar10 = 1;
  if ((iVar11 == 0 || u.uhp < iVar6) || (iVar10 = u.uhpmax, u.uhp = iVar11, u.uhpmax < iVar11)) {
    u.uhp = iVar10;
  }
  iVar6 = (int)urole.xlev;
  sVar4 = acurr(2);
  if (iVar5 < iVar6) {
    lVar9 = (long)urole.enadv.lornd;
    lVar12 = (long)urace.enadv.lornd;
    uVar7 = mt_random();
    iVar5 = SUB164(ZEXT416(uVar7) % SEXT816(lVar12 + sVar4 / '\x02' + lVar9),0);
    cVar1 = urole.enadv.lofix;
    cVar2 = urace.enadv.lofix;
  }
  else {
    lVar9 = (long)urole.enadv.hirnd;
    lVar12 = (long)urace.enadv.hirnd;
    uVar7 = mt_random();
    iVar5 = SUB164(ZEXT416(uVar7) % SEXT816(lVar12 + sVar4 / '\x02' + lVar9),0);
    cVar1 = urole.enadv.hifix;
    cVar2 = urace.enadv.hifix;
  }
  iVar5 = (int)cVar2 + (int)cVar1 + iVar5;
  uVar7 = (ushort)urole.malenum - 0x15a;
  if (uVar7 < 0xf) {
    if ((0x30U >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0x2001U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x4080U >> (uVar7 & 0x1f) & 1) != 0) {
          iVar5 = iVar5 * 2;
        }
      }
      else {
        iVar6 = iVar5 * 3 + 3;
        if (-1 < iVar5 * 3) {
          iVar6 = iVar5 * 3;
        }
        iVar5 = iVar6 >> 2;
      }
    }
    else {
      iVar5 = (iVar5 * 3) / 2;
    }
  }
  iVar6 = u.uenmax - iVar5;
  if (u.uenmax - iVar5 < 1) {
    iVar6 = 0;
  }
  u.uen = u.uen - iVar5;
  iVar5 = 0;
  if ((u.uen < 0) || (iVar5 = iVar6, iVar6 < u.uen)) {
    u.uen = iVar5;
  }
  if (u.uexp < 1) {
    iflags.botl = '\x01';
    u.uenmax = iVar6;
    return;
  }
  if (u.ulevel < 10) {
    lVar9 = 10;
    uVar7 = u.ulevel;
  }
  else {
    if (0x13 < u.ulevel) {
      iVar5 = (u.ulevel + -0x13) * 10000000;
      goto LAB_0019ba94;
    }
    uVar7 = (uint)(byte)((char)u.ulevel - 10);
    lVar9 = 10000;
  }
  iVar5 = (int)(lVar9 << ((byte)uVar7 & 0x3f));
LAB_0019ba94:
  u.uexp = iVar5 + -1;
  u.uenmax = iVar6;
  iflags.botl = '\x01';
  return;
}

Assistant:

void losexp(const char *drainer)		
{
	int num;

	/* override life-drain resistance when handling an explicit
	   wizard mode request to reduce level; never fatal though */
	if (drainer && !strcmp(drainer, "#levelchange"))
	    drainer = 0;
	else
	    if (resists_drli(&youmonst)) return;

	if (u.ulevel > 1) {
		pline("%s level %d.", Goodbye(), u.ulevel--);
		/* remove intrinsic abilities */
		adjabil(u.ulevel + 1, u.ulevel);
		reset_rndmonst(NON_PM);	/* new monster selection */
	} else {
		if (drainer) {
			killer_format = KILLED_BY;
			killer = drainer;
			done(DIED);
		}
		/* no drainer or lifesaved */
		u.uexp = 0;
	}
	num = newhp();
	u.uhpmax -= num;
	if (u.uhpmax < 1) u.uhpmax = 1;
	u.uhp -= num;
	if (u.uhp < 1) u.uhp = 1;
	else if (u.uhp > u.uhpmax) u.uhp = u.uhpmax;

	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);		/* M. Stephenson */
	u.uenmax -= num;
	if (u.uenmax < 0) u.uenmax = 0;
	u.uen -= num;
	if (u.uen < 0) u.uen = 0;
	else if (u.uen > u.uenmax) u.uen = u.uenmax;

	if (u.uexp > 0)
		u.uexp = newuexp(u.ulevel) - 1;
	iflags.botl = 1;
}